

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.c
# Opt level: O0

void av1_lookahead_destroy(lookahead_ctx *ctx)

{
  int *in_RDI;
  int i;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffffe8;
  int local_c;
  
  if (in_RDI != (int *)0x0) {
    if (*(long *)(in_RDI + 10) != 0) {
      for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
        aom_free_frame_buffer(in_stack_ffffffffffffffe8);
      }
      free(*(void **)(in_RDI + 10));
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void av1_lookahead_destroy(struct lookahead_ctx *ctx) {
  if (ctx) {
    if (ctx->buf) {
      int i;

      for (i = 0; i < ctx->max_sz; i++) aom_free_frame_buffer(&ctx->buf[i].img);
      free(ctx->buf);
    }
    free(ctx);
  }
}